

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BPBase.cpp
# Opt level: O2

TransformTypes __thiscall
adios2::format::BPBase::TransformTypeEnum(BPBase *this,string *transformType)

{
  __type _Var1;
  _Rb_tree_node_base *p_Var2;
  
  p_Var2 = (_Rb_tree_node_base *)m_TransformTypesToNames_abi_cxx11_._24_8_;
  while( true ) {
    if (p_Var2 == (_Rb_tree_node_base *)(m_TransformTypesToNames_abi_cxx11_ + 8)) {
      return transform_unknown;
    }
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &p_Var2[1]._M_parent,transformType);
    if (_Var1) break;
    p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
  }
  return p_Var2[1]._M_color;
}

Assistant:

BPBase::TransformTypes BPBase::TransformTypeEnum(const std::string transformType) const noexcept
{
    TransformTypes transformEnum = transform_unknown;

    for (const auto &pair : m_TransformTypesToNames)
    {
        if (pair.second == transformType)
        {
            transformEnum = static_cast<TransformTypes>(pair.first);
            break;
        }
    }
    return transformEnum;
}